

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testDeepImage.cpp
# Opt level: O0

void anon_unknown.dwarf_13b32::testScanLineImage(Box2i *dataWindow,string *fileName)

{
  ostream *poVar1;
  string *in_RSI;
  int *in_RDI;
  DeepImage img2;
  Rand48 random;
  DeepImage img1;
  unsigned_long in_stack_fffffffffffffe18;
  Rand48 *in_stack_fffffffffffffe20;
  DeepImage *img;
  allocator<char> *in_stack_fffffffffffffe50;
  allocator<char> *__a;
  allocator<char> *__s;
  char *pcVar2;
  DeepImage local_190 [32];
  int in_stack_fffffffffffffe90;
  int in_stack_fffffffffffffe94;
  DeepImage *in_stack_fffffffffffffe98;
  DeepImage *in_stack_fffffffffffffea0;
  allocator<char> local_121;
  string local_120 [39];
  DeepImage local_f9;
  string local_f8 [39];
  allocator<char> local_d1;
  string local_d0 [39];
  allocator<char> local_a9;
  string local_a8 [48];
  DeepImage local_78 [104];
  string *local_10;
  int *local_8;
  
  local_10 = in_RSI;
  local_8 = in_RDI;
  poVar1 = std::operator<<((ostream *)&std::cout,"scan lines, data window = (");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,*local_8);
  pcVar2 = ", ";
  poVar1 = std::operator<<(poVar1,", ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_8[1]);
  poVar1 = std::operator<<(poVar1,") - (");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_8[2]);
  poVar1 = std::operator<<(poVar1,pcVar2);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_8[3]);
  poVar1 = std::operator<<(poVar1,")");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  Imf_3_2::DeepImage::DeepImage(local_78);
  Imf_3_2::Image::resize((Box *)local_78);
  __s = &local_a9;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pcVar2,(char *)__s
             ,in_stack_fffffffffffffe50);
  Imf_3_2::Image::insertChannel((string *)local_78,(PixelType)local_a8,1,1,true);
  std::__cxx11::string::~string(local_a8);
  std::allocator<char>::~allocator(&local_a9);
  __a = &local_d1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pcVar2,(char *)__s
             ,__a);
  Imf_3_2::Image::insertChannel((string *)local_78,(PixelType)local_d0,1,1,true);
  std::__cxx11::string::~string(local_d0);
  std::allocator<char>::~allocator(&local_d1);
  img = &local_f9;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pcVar2,(char *)__s
             ,__a);
  Imf_3_2::Image::insertChannel((string *)local_78,(PixelType)local_f8,2,1,true);
  std::__cxx11::string::~string(local_f8);
  std::allocator<char>::~allocator((allocator<char> *)&local_f9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pcVar2,(char *)__s
             ,__a);
  Imf_3_2::Image::insertChannel((string *)local_78,(PixelType)local_120,0,1,true);
  std::__cxx11::string::~string(local_120);
  std::allocator<char>::~allocator(&local_121);
  Imath_3_2::Rand48::Rand48(in_stack_fffffffffffffe20,in_stack_fffffffffffffe18);
  poVar1 = std::operator<<((ostream *)&std::cout,"    generating random pixel values");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  fillChannels((Rand48 *)__a,img);
  poVar1 = std::operator<<((ostream *)&std::cout,"    saving file");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  Imf_3_2::saveDeepScanLineImage(local_10,local_78);
  Imf_3_2::DeepImage::DeepImage(local_190);
  poVar1 = std::operator<<((ostream *)&std::cout,"    loading file");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  Imf_3_2::loadDeepImage(local_10,local_190);
  poVar1 = std::operator<<((ostream *)&std::cout,"    comparing");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  verifyImagesAreEqual
            (in_stack_fffffffffffffea0,in_stack_fffffffffffffe98,in_stack_fffffffffffffe94,
             in_stack_fffffffffffffe90);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  remove(pcVar2);
  Imf_3_2::DeepImage::~DeepImage(local_190);
  Imf_3_2::DeepImage::~DeepImage(local_78);
  return;
}

Assistant:

void
testScanLineImage (const Box2i& dataWindow, const string& fileName)
{
    cout << "scan lines, data window = "
            "("
         << dataWindow.min.x << ", " << dataWindow.min.y
         << ") - "
            "("
         << dataWindow.max.x << ", " << dataWindow.max.y << ")" << endl;

    DeepImage img1;
    img1.resize (dataWindow);

    img1.insertChannel ("H1", HALF, 1, 1, false);
    img1.insertChannel ("H2", HALF, 1, 1, true);
    img1.insertChannel ("F", FLOAT, 1, 1, false);
    img1.insertChannel ("UI", UINT, 1, 1, false);

    Rand48 random (0);
    cout << "    generating random pixel values" << endl;
    fillChannels (random, img1);

    cout << "    saving file" << endl;
    saveDeepScanLineImage (fileName, img1);

    DeepImage img2;

    cout << "    loading file" << endl;
    loadDeepImage (fileName, img2);

    cout << "    comparing" << endl;
    verifyImagesAreEqual (img1, img2);

    remove (fileName.c_str ());
}